

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O1

Message * __thiscall testing::Message::operator<<(Message *this,wchar_t *wide_c_str)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  char *pcVar2;
  size_t sVar3;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  char local_41;
  String local_40;
  
  internal::String::ShowWideCString(&local_40,wide_c_str);
  pcVar2 = local_40.c_str_;
  pbVar1 = (this->ss_).ptr_;
  pbVar4 = pbVar1 + 0x10;
  if (pbVar1 == (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pbVar4 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  if (local_40.c_str_ == (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar4,"(null)",6);
  }
  else if (local_40.length_ != 0) {
    sVar3 = 0;
    do {
      if (pcVar2[sVar3] == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar4,"\\0",2);
      }
      else {
        local_41 = pcVar2[sVar3];
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar4,&local_41,1);
      }
      sVar3 = sVar3 + 1;
    } while (sVar3 != local_40.length_);
  }
  if (local_40.c_str_ != (char *)0x0) {
    operator_delete__(local_40.c_str_);
  }
  return this;
}

Assistant:

Message& operator <<(wchar_t* wide_c_str) {
    return *this << internal::String::ShowWideCString(wide_c_str);
  }